

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
::on_replacement_field
          (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,char *p)

{
  type tVar1;
  iterator in_RDI;
  type tVar2;
  iterator it;
  custom_formatter<char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  f;
  basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_000000b8;
  arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_000000c0;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_stack_ffffffffffffffa0;
  format_specs *in_stack_ffffffffffffffd0;
  context_type *in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  custom_formatter<char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  in_stack_ffffffffffffffe8;
  
  internal::
  context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
  ::parse_context((context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
                   *)(in_RDI + 8));
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
            (in_stack_ffffffffffffffa0,in_RDI);
  internal::
  custom_formatter<char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  ::custom_formatter((custom_formatter<char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                      *)&stack0xffffffffffffffe8,
                     (basic_format_context<fmt::v5::internal::counting_iterator<char>,_char> *)
                     (in_RDI + 8));
  tVar1 = visit_format_arg<fmt::v5::internal::custom_formatter<char,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>&,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>
                    ((custom_formatter<char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                      *)in_stack_ffffffffffffffe8.ctx_,
                     (basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                      *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0));
  if (!tVar1) {
    arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
    arg_formatter((arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                   *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),
                  in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    tVar2 = visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>
                      (in_stack_000000c0,in_stack_000000b8);
    it._9_7_ = 0;
    it.count_ = (long)tVar2._0_9_;
    it.blackhole_ = (char)(tVar2._0_9_ >> 0x40);
    internal::
    context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
    ::advance_to((context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
                  *)(in_RDI + 8),it);
  }
  return;
}

Assistant:

void on_replacement_field(const Char *p) {
    context.parse_context().advance_to(p);
    internal::custom_formatter<Char, Context> f(context);
    if (!visit_format_arg(f, arg))
      context.advance_to(visit_format_arg(ArgFormatter(context), arg));
  }